

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

ostream * __thiscall amrex::BoxArray::writeOn(BoxArray *this,ostream *os)

{
  long *plVar1;
  BATType BVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  IndexType IVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  ulong uVar10;
  int dir_1;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  IntVect IVar18;
  Box result;
  Box bx;
  ulong local_40;
  int local_38;
  
  poVar9 = std::operator<<(os,'(');
  poVar9 = std::ostream::_M_insert<long>((long)poVar9);
  poVar9 = std::operator<<(poVar9,' ');
  uVar14 = 0;
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
  std::operator<<(poVar9,'\n');
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar10 = ((long)*(pointer *)
                   ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data + 8) -
           *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data) / 0x1c;
  BVar2 = (this->m_bat).m_bat_type;
  iVar17 = (int)uVar10;
  if (BVar2 == bndryReg) {
    uVar10 = uVar10 & 0xffffffff;
    if (iVar17 < 1) {
      uVar10 = uVar14;
    }
    for (; uVar10 * 0x1c - uVar14 != 0; uVar14 = uVar14 + 0x1c) {
      BATbndryReg::operator()
                (&bx,&(this->m_bat).m_op.m_bndryReg,
                 (Box *)(*(long *)&(peVar3->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + uVar14));
      poVar9 = amrex::operator<<(os,&bx);
      std::operator<<(poVar9,'\n');
    }
  }
  else if (BVar2 == null) {
    uVar14 = 0;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar17 < 1) {
      uVar10 = uVar14;
    }
    for (; uVar10 * 0x1c - uVar14 != 0; uVar14 = uVar14 + 0x1c) {
      poVar9 = amrex::operator<<(os,(Box *)(*(long *)&(peVar3->m_abox).
                                                                                                            
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + uVar14));
      std::operator<<(poVar9,'\n');
    }
  }
  else {
    IVar6 = BATransformer::index_type(&this->m_bat);
    IVar18 = BATransformer::coarsen_ratio(&this->m_bat);
    iVar13 = IVar18.vect[2];
    local_40 = IVar18.vect._0_8_;
    iVar16 = IVar18.vect[0];
    uVar14 = 0;
    uVar10 = uVar10 & 0xffffffff;
    if (iVar17 < 1) {
      uVar10 = uVar14;
    }
    local_38 = iVar13;
    for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
      lVar12 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data;
      plVar1 = (long *)(lVar12 + uVar14 * 0x1c);
      lVar15 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar12 + 0xc + uVar14 * 0x1c);
      lVar12 = *plVar1;
      lVar5 = plVar1[1];
      result.bigend.vect[1] = (int)((ulong)lVar12 >> 0x20);
      result.bigend.vect[2] = (int)lVar5;
      result.btype.itype = (int)((ulong)lVar5 >> 0x20);
      result.smallend.vect[2] = (int)lVar4;
      result.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
      iVar17 = IVar18.vect[1];
      result.smallend.vect[1] = (int)((ulong)lVar15 >> 0x20);
      uVar8 = result.smallend.vect[1];
      if (IVar18.vect._0_8_ >> 0x20 == 1 && iVar16 == 1) {
        result.smallend.vect._0_8_ = lVar15;
        if (iVar13 != 1) goto LAB_0041bb62;
      }
      else {
        result.smallend.vect[0] = (int)lVar15;
        if (iVar16 != 1) {
          if (iVar16 == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (iVar16 == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar16);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / iVar16;
          }
        }
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if (lVar15 < 0) {
              uVar8 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (iVar17 == 2) {
            if (lVar15 < 0) {
              uVar8 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar15 < 0) {
            uVar8 = ~(~result.smallend.vect[1] / iVar17);
          }
          else {
            uVar8 = result.smallend.vect[1] / iVar17;
          }
        }
LAB_0041bb62:
        result.smallend.vect[1] = uVar8;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (iVar13 == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar13);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / iVar13;
          }
        }
        result.btype.itype = (uint)((ulong)lVar5 >> 0x20);
        result.bigend.vect[2] = (int)lVar5;
        if (result.btype.itype == 0) {
          uVar8 = result.bigend.vect[0];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar16);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar16;
            }
          }
          result.bigend.vect[0] = uVar8;
          uVar8 = result.bigend.vect[1];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar8 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar8 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar8 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar8 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar8 = ~(~result.bigend.vect[1] / iVar17);
            }
            else {
              uVar8 = result.bigend.vect[1] / iVar17;
            }
          }
          result.bigend.vect[1] = uVar8;
          uVar8 = result.bigend.vect[2];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar8 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar8 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar8 = ~(~result.bigend.vect[2] / iVar13);
            }
            else {
              uVar8 = result.bigend.vect[2] / iVar13;
            }
          }
        }
        else {
          bx.smallend.vect[0] = 0;
          bx.smallend.vect[1] = 0;
          bx.smallend.vect[2] = 0;
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            if (((result.btype.itype >> ((uint)lVar15 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar15] % *(int *)((long)&local_40 + lVar15 * 4) != 0)) {
              bx.smallend.vect[lVar15] = 1;
            }
          }
          uVar8 = result.bigend.vect[0];
          if (iVar16 != 1) {
            if (iVar16 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar16 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar16);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar16;
            }
          }
          uVar11 = result.bigend.vect[1];
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar11 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar11 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar11 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar11 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar11 = ~(~result.bigend.vect[1] / iVar17);
            }
            else {
              uVar11 = result.bigend.vect[1] / iVar17;
            }
          }
          uVar7 = result.bigend.vect[2];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar7 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar7 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar7 = ~(~result.bigend.vect[2] / iVar13);
            }
            else {
              uVar7 = result.bigend.vect[2] / iVar13;
            }
          }
          result.bigend.vect[0] = uVar8 + bx.smallend.vect[0];
          result.bigend.vect[1] = uVar11 + bx.smallend.vect[1];
          uVar8 = uVar7 + bx.smallend.vect[2];
        }
        result.bigend.vect[2] = uVar8;
      }
      bx.bigend.vect[1] = result.bigend.vect[1];
      bx.bigend.vect[2] = result.bigend.vect[2];
      bx.btype = result.btype;
      bx.smallend.vect[0] = result.smallend.vect[0];
      bx.smallend.vect[1] = result.smallend.vect[1];
      bx.smallend.vect[2] = result.smallend.vect[2];
      bx.bigend.vect[0] = result.bigend.vect[0];
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        uVar8 = 1 << ((byte)lVar12 & 0x1f);
        uVar11 = (uint)lVar12;
        bx.bigend.vect[lVar12] =
             (bx.bigend.vect[lVar12] + (uint)((IVar6.itype >> (uVar11 & 0x1f) & 1) != 0)) -
             (uint)((bx.btype.itype >> (uVar11 & 0x1f) & 1) != 0);
        if ((IVar6.itype >> (uVar11 & 0x1f) & 1) == 0) {
          bx.btype.itype = ~uVar8 & bx.btype.itype;
        }
        else {
          bx.btype.itype = uVar8 | bx.btype.itype;
        }
      }
      poVar9 = amrex::operator<<(os,&bx);
      std::operator<<(poVar9,'\n');
    }
  }
  std::operator<<(os,')');
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("BoxArray::writeOn(ostream&) failed");
  }
  return os;
}

Assistant:

std::ostream&
BoxArray::writeOn (std::ostream& os) const
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    os << '(' << size() << ' ' << 0 << '\n';

    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
        for (int i = 0; i < N; ++i) {
            os << bxs[i] << '\n';
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
        for (int i = 0; i < N; ++i) {
            os << amrex::convert(amrex::coarsen(bxs[i],cr),t) << '\n';
        }
    } else {
        for (int i = 0; i < N; ++i) {
            os << m_bat.m_op.m_bndryReg(bxs[i]) << '\n';
        }
    }

    os << ')';

    if (os.fail())
        amrex::Error("BoxArray::writeOn(ostream&) failed");

    return os;
}